

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snedecor_f_dist.hpp
# Opt level: O3

result_type_conflict3 * __thiscall
trng::snedecor_f_dist<long_double>::cdf
          (result_type_conflict3 *__return_storage_ptr__,snedecor_f_dist<long_double> *this,
          result_type_conflict3 x)

{
  int iVar1;
  result_type_conflict3 *prVar2;
  longdouble in_ST0;
  longdouble lVar3;
  longdouble x_00;
  longdouble y;
  
  iVar1 = *(int *)((long)__return_storage_ptr__ + 4);
  lVar3 = x._0_10_ * (longdouble)*(int *)__return_storage_ptr__;
  x_00 = (longdouble)*(int *)__return_storage_ptr__ * (longdouble)0.5;
  y = (longdouble)0.5 * (longdouble)iVar1;
  math::detail::Beta<long_double>((longdouble *)__return_storage_ptr__,x_00,y);
  prVar2 = (result_type_conflict3 *)
           math::detail::Beta_I<long_double>
                     ((longdouble *)__return_storage_ptr__,lVar3 / (lVar3 + (longdouble)iVar1),x_00,
                      y,in_ST0);
  return prVar2;
}

Assistant:

cdf(result_type x) const {
      const result_type n{static_cast<result_type>(P.n())};
      const result_type m{static_cast<result_type>(P.m())};
      return math::Beta_I(n * x / (m + n * x), result_type(1) / result_type(2) * n,
                          result_type(1) / result_type(2) * m);
    }